

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

void job_ini(job_t *job)

{
  job_t *job_local;
  
  memset(job,0,0x218);
  memset(&job->cmdv,0,0x30);
  (job->cmdv).icd.sz = 8;
  (job->cmdv).icd.init = (undefined1 *)0x0;
  (job->cmdv).icd.copy = utarray_str_cpy;
  (job->cmdv).icd.dtor = utarray_str_dtor;
  memset(&job->envv,0,0x30);
  (job->envv).icd.sz = 8;
  (job->envv).icd.init = (undefined1 *)0x0;
  (job->envv).icd.copy = utarray_str_cpy;
  (job->envv).icd.dtor = utarray_str_dtor;
  memset(&job->depv,0,0x30);
  (job->depv).icd.sz = 8;
  (job->depv).icd.init = (undefined1 *)0x0;
  (job->depv).icd.copy = utarray_str_cpy;
  (job->depv).icd.dtor = utarray_str_dtor;
  memset(&job->rlim,0,0x30);
  (job->rlim).icd.sz = 0x18;
  (job->rlim).icd.init = (undefined1 *)0x0;
  (job->rlim).icd.copy = (ctor_f *)0x0;
  (job->rlim).icd.dtor = (undefined1 *)0x0;
  memset(&job->cpuset,0,0x80);
  job->respawn = 1;
  return;
}

Assistant:

void job_ini(job_t *job) { 
  memset(job,0,sizeof(*job));
  utarray_init(&job->cmdv, &ut_str_icd); 
  utarray_init(&job->envv, &ut_str_icd); 
  utarray_init(&job->depv, &ut_str_icd); 
  utarray_init(&job->rlim, &rlimit_icd); 
  CPU_ZERO(&job->cpuset);
  job->respawn=1;
}